

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_data.cpp
# Opt level: O3

Euler_Data * Get_Euler(void)

{
  double dVar1;
  bool bVar2;
  Euler_Data *in_RDI;
  unique_lock<std::timed_mutex> euler_lock;
  unique_lock<std::timed_mutex> local_20;
  duration<long,_std::ratio<1L,_1000L>_> local_10;
  
  local_20._M_device = &Euler_Mutex;
  local_20._M_owns = false;
  local_10.__r = 5;
  bVar2 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                    (&local_20,&local_10);
  if (bVar2) {
    in_RDI->yaw = Euler.yaw;
    dVar1 = Euler.pitch;
    in_RDI->roll = Euler.roll;
    in_RDI->pitch = dVar1;
    std::unique_lock<std::timed_mutex>::unlock(&local_20);
  }
  else {
    in_RDI->roll = 0.0;
    in_RDI->pitch = 0.0;
    in_RDI->yaw = 0.0;
  }
  std::unique_lock<std::timed_mutex>::~unique_lock(&local_20);
  return in_RDI;
}

Assistant:

Euler_Data Get_Euler()
{
    unique_lock<timed_mutex> euler_lock(Euler_Mutex, defer_lock);

    if (!euler_lock.try_lock_for(chrono::milliseconds(5)))
        return Euler_Data();

    Euler_Data ret = Euler;

    euler_lock.unlock();

    return ret;
}